

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

LinearSpace3fa * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,size_t primID,BBox1f time_range)

{
  float *pfVar1;
  float *pfVar2;
  BBox1f BVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar14;
  float fVar15;
  undefined1 auVar13 [16];
  vfloat4 a0;
  float fVar16;
  float fVar19;
  float fVar20;
  vfloat4 b1;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar26 [16];
  float fVar33;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar34;
  vfloat4 a;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  vfloat4 a_1;
  undefined1 auVar40 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  
  BVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.time_range;
  fVar32 = BVar3.lower;
  fVar11 = BVar3.upper;
  fVar30 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           super_Geometry.fnumTimeSegments;
  auVar18._4_4_ = fVar11;
  auVar18._0_4_ = fVar11;
  auVar18._8_4_ = fVar11;
  auVar18._12_4_ = fVar11;
  auVar17._4_12_ = auVar18._4_12_;
  auVar17._0_4_ = fVar11 - fVar32;
  fVar24 = (time_range.upper - fVar32) / auVar17._0_4_;
  fVar11 = floorf(((time_range.lower - fVar32) / auVar17._0_4_) * 1.0000002 * fVar30);
  fVar32 = 0.0;
  if (0.0 <= fVar11) {
    fVar32 = fVar11;
  }
  fVar11 = ceilf(fVar24 * 0.99999976 * fVar30);
  if (fVar30 <= fVar11) {
    fVar11 = fVar30;
  }
  if ((int)fVar11 == (int)fVar32) {
    auVar18 = rsqrtss(auVar17,0x3f800000);
    fVar30 = auVar18._0_4_;
    fVar21 = fVar30 * 1.5 - fVar30 * fVar30 * fVar30 * 0.5;
    fVar16 = fVar21 * -1.0;
    fVar19 = fVar21 * 0.0;
    fVar20 = fVar21 * 0.0;
    fVar21 = fVar21 * 0.0;
    fVar25 = fVar19 * 0.0 + fVar16 * -0.0;
    fVar29 = fVar20 * 0.0 + fVar19 * -1.0;
    fVar31 = fVar16 * 1.0 + fVar20 * -0.0;
    fVar11 = fVar21 * 0.0 + fVar21 * -0.0;
    fVar30 = fVar29 * fVar29;
    fVar32 = fVar31 * fVar31;
    fVar24 = fVar11 * fVar11;
    fVar38 = fVar32 + fVar30 + fVar25 * fVar25;
    auVar39._0_8_ = CONCAT44(fVar24 + fVar30 + fVar30,fVar38);
    auVar39._8_4_ = fVar32 + fVar30 + fVar32;
    auVar39._12_4_ = fVar24 + fVar30 + fVar24;
    auVar26._8_4_ = auVar39._8_4_;
    auVar26._0_8_ = auVar39._0_8_;
    auVar26._12_4_ = auVar39._12_4_;
    auVar18 = rsqrtss(auVar26,auVar39);
    fVar30 = auVar18._0_4_;
    fVar38 = fVar30 * 1.5 - fVar30 * fVar30 * fVar38 * 0.5 * fVar30;
    fVar29 = fVar38 * fVar29;
    fVar31 = fVar38 * fVar31;
    fVar25 = fVar38 * fVar25;
    fVar38 = fVar38 * fVar11;
    fVar30 = 0.0;
    fVar32 = 0.0;
    fVar11 = 1.0;
    fVar24 = 0.0;
  }
  else {
    iVar10 = ((int)fVar32 + (int)fVar11) / 2;
    pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             vertices.items;
    uVar4 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                super_CurveGeometry.super_Geometry.field_0x58 +
                     primID * *(long *)&(this->
                                        super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                        super_CurveGeometry.field_0x68);
    pcVar6 = pBVar5[iVar10].super_RawBufferView.ptr_ofs;
    sVar7 = pBVar5[iVar10].super_RawBufferView.stride;
    pfVar1 = (float *)(pcVar6 + sVar7 * uVar4);
    fVar29 = *pfVar1;
    fVar31 = pfVar1[1];
    fVar38 = pfVar1[2];
    pfVar2 = (float *)(pcVar6 + sVar7 * (uVar4 + 1));
    fVar19 = *pfVar2;
    fVar21 = pfVar2[1];
    fVar16 = pfVar2[2];
    pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             tangents.items;
    sVar7 = pBVar5[iVar10].super_RawBufferView.stride;
    fVar25 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             maxRadiusScale;
    fVar20 = pfVar1[3] * fVar25;
    fVar12 = pfVar2[3] * fVar25;
    fVar30 = fVar19 - fVar29;
    fVar32 = fVar21 - fVar31;
    fVar11 = fVar16 - fVar38;
    fVar33 = fVar12 - fVar20;
    fVar24 = fVar32 * fVar32;
    fVar14 = fVar11 * fVar11;
    fVar15 = fVar33 * fVar33;
    fVar34 = fVar24 + fVar30 * fVar30 + fVar14;
    auVar35._0_8_ = CONCAT44(fVar24 + fVar24 + fVar15,fVar34);
    auVar35._8_4_ = fVar24 + fVar14 + fVar14;
    auVar35._12_4_ = fVar24 + fVar15 + fVar15;
    auVar13._8_4_ = auVar35._8_4_;
    auVar13._0_8_ = auVar35._0_8_;
    auVar13._12_4_ = auVar35._12_4_;
    auVar18 = rsqrtss(auVar13,auVar35);
    fVar24 = auVar18._0_4_;
    fVar24 = fVar24 * fVar24 * fVar34 * -0.5 * fVar24 + fVar24 * 1.5;
    fVar30 = fVar24 * fVar30;
    fVar32 = fVar24 * fVar32;
    fVar11 = fVar24 * fVar11;
    fVar24 = fVar24 * fVar33;
    if (1e-18 < fVar34) {
      pcVar6 = pBVar5[iVar10].super_RawBufferView.ptr_ofs;
      pfVar1 = (float *)(pcVar6 + uVar4 * sVar7);
      pfVar2 = (float *)(pcVar6 + sVar7 * (uVar4 + 1));
      fVar19 = ((*pfVar1 * 0.33333334 + fVar29) * 3.0 +
               (fVar19 - *pfVar2 * 0.33333334) * 0.0 + fVar19 * 0.0) - fVar29 * 3.0;
      fVar29 = ((pfVar1[1] * 0.33333334 + fVar31) * 3.0 +
               (fVar21 - pfVar2[1] * 0.33333334) * 0.0 + fVar21 * 0.0) - fVar31 * 3.0;
      fVar31 = ((pfVar1[2] * 0.33333334 + fVar38) * 3.0 +
               (fVar16 - pfVar2[2] * 0.33333334) * 0.0 + fVar16 * 0.0) - fVar38 * 3.0;
      fVar38 = ((pfVar1[3] * fVar25 * 0.33333334 + fVar20) * 3.0 +
               (fVar12 - pfVar2[3] * fVar25 * 0.33333334) * 0.0 + fVar12 * 0.0) - fVar20 * 3.0;
      fVar25 = fVar29 * fVar30 - fVar32 * fVar19;
      fVar29 = fVar31 * fVar32 - fVar11 * fVar29;
      fVar31 = fVar19 * fVar11 - fVar30 * fVar31;
      fVar38 = fVar38 * fVar24 - fVar24 * fVar38;
    }
    else {
      fVar29 = 0.0;
      fVar31 = 1.0;
      fVar25 = 0.0;
      fVar38 = 0.0;
      fVar30 = 0.0;
      fVar32 = 0.0;
      fVar11 = 1.0;
      fVar24 = 0.0;
    }
    fVar19 = fVar31 * fVar31;
    fVar21 = fVar25 * fVar25;
    fVar16 = fVar38 * fVar38;
    fVar20 = fVar19 + fVar29 * fVar29 + fVar21;
    auVar27._0_8_ = CONCAT44(fVar19 + fVar19 + fVar16,fVar20);
    auVar27._8_4_ = fVar19 + fVar21 + fVar21;
    auVar27._12_4_ = fVar19 + fVar16 + fVar16;
    if (fVar20 <= 1e-18) {
      fVar25 = -fVar32;
      fVar16 = -fVar11;
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      if (fVar25 * fVar25 + fVar11 * fVar11 + 0.0 <= fVar30 * fVar30 + fVar16 * fVar16 + 0.0) {
        auVar22 = SUB1612((undefined1  [16])0x0,0);
      }
      fVar19 = (float)((uint)fVar11 & auVar22._4_4_);
      fVar16 = (float)(~auVar22._0_4_ & (uint)fVar16);
      fVar20 = (float)(~auVar22._8_4_ & (uint)fVar30 | (uint)fVar25 & auVar22._8_4_);
      fVar25 = fVar19 * fVar19;
      fVar29 = fVar20 * fVar20;
      fVar31 = fVar25 + fVar16 * fVar16 + fVar29;
      auVar37._0_8_ = CONCAT44(fVar25 + fVar25 + 0.0,fVar31);
      auVar37._8_4_ = fVar25 + fVar29 + fVar29;
      auVar37._12_4_ = fVar25 + 0.0 + 0.0;
      auVar40._8_4_ = auVar37._8_4_;
      auVar40._0_8_ = auVar37._0_8_;
      auVar40._12_4_ = auVar37._12_4_;
      auVar18 = rsqrtss(auVar40,auVar37);
      fVar25 = auVar18._0_4_;
      fVar21 = fVar25 * 1.5 - fVar25 * fVar25 * fVar31 * 0.5 * fVar25;
      fVar16 = fVar21 * fVar16;
      fVar19 = fVar21 * fVar19;
      fVar20 = fVar21 * fVar20;
      fVar21 = fVar21 * 0.0;
      fVar25 = fVar19 * fVar30 - fVar32 * fVar16;
      fVar29 = fVar20 * fVar32 - fVar11 * fVar19;
      fVar31 = fVar16 * fVar11 - fVar30 * fVar20;
      fVar14 = fVar21 * fVar24 - fVar24 * fVar21;
      fVar38 = fVar29 * fVar29;
      fVar12 = fVar31 * fVar31;
      fVar15 = fVar14 * fVar14;
      fVar33 = fVar12 + fVar38 + fVar25 * fVar25;
      fVar34 = fVar15 + fVar38 + fVar38;
      fVar12 = fVar12 + fVar38 + fVar12;
      fVar15 = fVar15 + fVar38 + fVar15;
      auVar23._4_4_ = fVar34;
      auVar23._0_4_ = fVar33;
      auVar23._8_4_ = fVar12;
      auVar23._12_4_ = fVar15;
      auVar9._4_4_ = fVar34;
      auVar9._0_4_ = fVar33;
      auVar9._8_4_ = fVar12;
      auVar9._12_4_ = fVar15;
      auVar18 = rsqrtss(auVar23,auVar9);
      fVar38 = auVar18._0_4_;
      fVar38 = fVar38 * 1.5 - fVar38 * fVar38 * fVar33 * 0.5 * fVar38;
      fVar29 = fVar38 * fVar29;
      fVar31 = fVar38 * fVar31;
      fVar25 = fVar38 * fVar25;
      fVar38 = fVar38 * fVar14;
    }
    else {
      auVar36._8_4_ = auVar27._8_4_;
      auVar36._0_8_ = auVar27._0_8_;
      auVar36._12_4_ = auVar27._12_4_;
      auVar18 = rsqrtss(auVar36,auVar27);
      fVar19 = auVar18._0_4_;
      fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * fVar20 * 0.5 * fVar19;
      fVar29 = fVar29 * fVar19;
      fVar31 = fVar31 * fVar19;
      fVar25 = fVar25 * fVar19;
      fVar38 = fVar38 * fVar19;
      fVar20 = fVar32 * fVar29 - fVar31 * fVar30;
      fVar16 = fVar11 * fVar31 - fVar25 * fVar32;
      fVar19 = fVar30 * fVar25 - fVar29 * fVar11;
      fVar14 = fVar24 * fVar38 - fVar38 * fVar24;
      fVar21 = fVar16 * fVar16;
      fVar12 = fVar19 * fVar19;
      fVar15 = fVar14 * fVar14;
      fVar33 = fVar12 + fVar21 + fVar20 * fVar20;
      fVar34 = fVar15 + fVar21 + fVar21;
      fVar12 = fVar12 + fVar21 + fVar12;
      fVar15 = fVar15 + fVar21 + fVar15;
      auVar28._4_4_ = fVar34;
      auVar28._0_4_ = fVar33;
      auVar28._8_4_ = fVar12;
      auVar28._12_4_ = fVar15;
      auVar8._4_4_ = fVar34;
      auVar8._0_4_ = fVar33;
      auVar8._8_4_ = fVar12;
      auVar8._12_4_ = fVar15;
      auVar18 = rsqrtss(auVar28,auVar8);
      fVar21 = auVar18._0_4_;
      fVar21 = fVar21 * 1.5 - fVar21 * fVar21 * fVar33 * 0.5 * fVar21;
      fVar16 = fVar21 * fVar16;
      fVar19 = fVar21 * fVar19;
      fVar20 = fVar21 * fVar20;
      fVar21 = fVar21 * fVar14;
    }
  }
  (__return_storage_ptr__->vx).field_0.m128[0] = fVar16;
  (__return_storage_ptr__->vx).field_0.m128[1] = fVar19;
  (__return_storage_ptr__->vx).field_0.m128[2] = fVar20;
  (__return_storage_ptr__->vx).field_0.m128[3] = fVar21;
  (__return_storage_ptr__->vy).field_0.m128[0] = fVar29;
  (__return_storage_ptr__->vy).field_0.m128[1] = fVar31;
  (__return_storage_ptr__->vy).field_0.m128[2] = fVar25;
  (__return_storage_ptr__->vy).field_0.m128[3] = fVar38;
  (__return_storage_ptr__->vz).field_0.m128[0] = fVar30;
  (__return_storage_ptr__->vz).field_0.m128[1] = fVar32;
  (__return_storage_ptr__->vz).field_0.m128[2] = fVar11;
  (__return_storage_ptr__->vz).field_0.m128[3] = fVar24;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);

        const range<int> tbounds = this->timeSegmentRange(time_range);
        if (tbounds.size() == 0) return frame(axisz);
        
        const size_t t = (tbounds.begin()+tbounds.end())/2;
        const Curve3ff curve = getCurveScaledRadius(primID,t);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }